

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall summarycalc::loadgulsummaryxref(summarycalc *this)

{
  FILE *__stream;
  size_t sVar1;
  long lVar2;
  string file;
  gulsummaryxref s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&file,"input/gulsummaryxref.bin",(allocator *)&s);
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   &this->inputpath_,&local_48);
    std::__cxx11::string::operator=((string *)&file,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::~string((string *)&local_48);
  }
  __stream = fopen(file._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: Error opening file %s\n","loadgulsummaryxref",file._M_dataplus._M_p)
    ;
  }
  else {
    init_c_to_s(this);
    while( true ) {
      sVar1 = fread(&s,0xc,1,__stream);
      if ((int)sVar1 == 0) {
        fclose(__stream);
        std::__cxx11::string::~string((string *)&file);
        return;
      }
      lVar2 = (long)s.summaryset_id;
      if (9 < lVar2) break;
      if (this->fout[lVar2] != (FILE *)0x0) {
        if (s.summary_id < this->min_summary_id_[lVar2]) {
          this->min_summary_id_[lVar2] = s.summary_id;
        }
        if (this->max_summary_id_[lVar2] < s.summary_id) {
          this->max_summary_id_[lVar2] = s.summary_id;
        }
        (this->co_to_s_[lVar2]->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[s.coverage_id] = s.summary_id;
      }
    }
    fprintf(_stderr,"FATAL: %s: Invalid summaryset id  %d found in %s\n","loadgulsummaryxref",lVar2,
            file._M_dataplus._M_p);
  }
  exit(-1);
}

Assistant:

void summarycalc::loadgulsummaryxref()
{
	std::string file = GULSUMMARYXREF_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	FILE *fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__, file.c_str());
		::exit(-1);
	}

	init_c_to_s();
	gulsummaryxref s;
	int i = (int)fread(&s, sizeof(gulsummaryxref), 1, fin);
	while (i != 0) {
		if (s.summaryset_id > 9) {
			fprintf(stderr, "FATAL: %s: Invalid summaryset id  %d found in %s\n", __func__, s.summaryset_id, file.c_str());
			::exit(-1);
		}
		if (fout[s.summaryset_id] != nullptr) {
			if (s.summary_id < min_summary_id_[s.summaryset_id]) min_summary_id_[s.summaryset_id] = s.summary_id;
			if (s.summary_id > max_summary_id_[s.summaryset_id]) max_summary_id_[s.summaryset_id] = s.summary_id;
			(*co_to_s_[s.summaryset_id])[s.coverage_id] = s.summary_id ;
		}
		i = (int) fread(&s, sizeof(gulsummaryxref), 1, fin);
	}

	fclose(fin);
}